

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O1

void __thiscall
sentencepiece::NormalizerSpec::NormalizerSpec(NormalizerSpec *this,NormalizerSpec *from)

{
  InternalMetadata *this_00;
  bool bVar1;
  void *pvVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)0x0;
  (this->super_MessageLite)._internal_metadata_.ptr_ = (void *)0x0;
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  (this->super_MessageLite)._internal_metadata_.ptr_ = (void *)0x0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__NormalizerSpec_002126f0;
  (this->_extensions_).arena_ = (Arena *)0x0;
  (this->_extensions_).flat_capacity_ = 0;
  (this->_extensions_).flat_size_ = 0;
  (this->_extensions_).map_.flat = (KeyValue *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  pvVar2 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    if (((ulong)this_00->ptr_ & 1) == 0) {
      pbVar3 = google::protobuf::internal::InternalMetadata::
               mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
    }
    else {
      pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (((ulong)this_00->ptr_ & 0xfffffffffffffffe) + 8);
    }
    std::__cxx11::string::_M_append
              ((char *)pbVar3,*(ulong *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 8));
  }
  google::protobuf::internal::ExtensionSet::MergeFrom(&this->_extensions_,&from->_extensions_);
  (this->name_).tagged_ptr_.ptr_ = &google::protobuf::internal::fixed_address_empty_string;
  if (((from->_has_bits_).has_bits_[0] & 1) != 0) {
    pvVar2 = this_00->ptr_;
    if (((ulong)pvVar2 & 1) != 0) {
      pvVar2 = *(void **)((ulong)pvVar2 & 0xfffffffffffffffe);
    }
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->name_,(ulong)(from->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe,pvVar2);
  }
  (this->precompiled_charsmap_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string;
  if (((from->_has_bits_).has_bits_[0] & 2) != 0) {
    pvVar2 = this_00->ptr_;
    if (((ulong)pvVar2 & 1) != 0) {
      pvVar2 = *(void **)((ulong)pvVar2 & 0xfffffffffffffffe);
    }
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->precompiled_charsmap_,
               (ulong)(from->precompiled_charsmap_).tagged_ptr_.ptr_ & 0xfffffffffffffffe,pvVar2);
  }
  (this->normalization_rule_tsv_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string;
  if (((from->_has_bits_).has_bits_[0] & 4) != 0) {
    pvVar2 = this_00->ptr_;
    if (((ulong)pvVar2 & 1) != 0) {
      pvVar2 = *(void **)((ulong)pvVar2 & 0xfffffffffffffffe);
    }
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->normalization_rule_tsv_,
               (ulong)(from->normalization_rule_tsv_).tagged_ptr_.ptr_ & 0xfffffffffffffffe,pvVar2);
  }
  this->escape_whitespaces_ = from->escape_whitespaces_;
  bVar1 = from->remove_extra_whitespaces_;
  this->add_dummy_prefix_ = from->add_dummy_prefix_;
  this->remove_extra_whitespaces_ = bVar1;
  return;
}

Assistant:

NormalizerSpec::NormalizerSpec(const NormalizerSpec& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      _has_bits_(from._has_bits_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  _extensions_.MergeFrom(from._extensions_);
  name_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_name()) {
    name_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_name(), 
      GetArena());
  }
  precompiled_charsmap_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_precompiled_charsmap()) {
    precompiled_charsmap_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_precompiled_charsmap(), 
      GetArena());
  }
  normalization_rule_tsv_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_normalization_rule_tsv()) {
    normalization_rule_tsv_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_normalization_rule_tsv(), 
      GetArena());
  }
  ::memcpy(&add_dummy_prefix_, &from.add_dummy_prefix_,
    static_cast<size_t>(reinterpret_cast<char*>(&escape_whitespaces_) -
    reinterpret_cast<char*>(&add_dummy_prefix_)) + sizeof(escape_whitespaces_));
  // @@protoc_insertion_point(copy_constructor:sentencepiece.NormalizerSpec)
}